

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infinite_impulse_response_digital_filter.cc
# Opt level: O1

bool __thiscall
sptk::InfiniteImpulseResponseDigitalFilter::Run
          (InfiniteImpulseResponseDigitalFilter *this,double input,double *output,Buffer *buffer)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  double *pdVar4;
  bool bVar5;
  int iVar6;
  bool bVar7;
  size_type __new_size;
  long lVar8;
  int iVar9;
  double dVar10;
  
  bVar7 = (bool)(buffer != (Buffer *)0x0 & output != (double *)0x0 & this->is_valid_);
  if (bVar7 == true) {
    __new_size = (long)this->num_filter_order_ + 1;
    if ((long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(&buffer->d_,__new_size);
      pdVar2 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar2 != pdVar3) {
        memset(pdVar2,0,((long)pdVar3 + (-8 - (long)pdVar2) & 0xfffffffffffffff8U) + 8);
      }
      buffer->p_ = 0;
    }
    pdVar2 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->denominator_coefficients_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar10 = -input * *pdVar4;
    iVar1 = buffer->p_;
    if (0 < this->num_denominator_order_) {
      lVar8 = 1;
      iVar6 = iVar1;
      do {
        bVar5 = iVar6 < 1;
        iVar6 = iVar6 + -1;
        if (bVar5) {
          iVar6 = this->num_filter_order_;
        }
        dVar10 = dVar10 + pdVar2[iVar6] * pdVar4[lVar8];
        lVar8 = lVar8 + 1;
      } while ((ulong)(uint)this->num_denominator_order_ + 1 != lVar8);
    }
    pdVar2[iVar1] = -dVar10;
    iVar6 = iVar1 + 1;
    if (this->num_numerator_order_ < 0) {
      dVar10 = 0.0;
    }
    else {
      dVar10 = 0.0;
      lVar8 = 0;
      iVar9 = iVar6;
      do {
        bVar5 = iVar9 < 1;
        iVar9 = iVar9 + -1;
        if (bVar5) {
          iVar9 = this->num_filter_order_;
        }
        dVar10 = dVar10 + pdVar2[iVar9] *
                          (this->numerator_coefficients_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8];
        lVar8 = lVar8 + 1;
      } while ((ulong)(uint)this->num_numerator_order_ + 1 != lVar8);
    }
    *output = dVar10;
    buffer->p_ = iVar6;
    iVar9 = 0;
    if (iVar1 < this->num_filter_order_) {
      iVar9 = iVar6;
    }
    buffer->p_ = iVar9;
  }
  return bVar7;
}

Assistant:

bool InfiniteImpulseResponseDigitalFilter::Run(
    double input, double* output,
    InfiniteImpulseResponseDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || NULL == output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d_.size() != static_cast<std::size_t>(num_filter_order_ + 1)) {
    buffer->d_.resize(num_filter_order_ + 1);
    std::fill(buffer->d_.begin(), buffer->d_.end(), 0.0);
    buffer->p_ = 0;
  }

  double* d(&buffer->d_[0]);

  {
    const double* a(&(denominator_coefficients_[0]));
    double x(-input * a[0]);
    for (int i(1), p(buffer->p_); i <= num_denominator_order_; ++i) {
      MovePointer(num_filter_order_, &p);
      x += d[p] * a[i];
    }
    d[buffer->p_] = -x;
  }

  {
    const double* b(&(numerator_coefficients_[0]));
    double y(0.0);
    for (int i(0), p(buffer->p_ + 1); i <= num_numerator_order_; ++i) {
      MovePointer(num_filter_order_, &p);
      y += d[p] * b[i];
    }
    *output = y;
  }

  // Update pointer of ring buffer.
  ++(buffer->p_);
  if (num_filter_order_ < buffer->p_) {
    buffer->p_ = 0;
  }

  return true;
}